

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Result wabt::ParseInt<unsigned_int>(char *s,char *end,uint *out,ParseIntType parse_type)

{
  ulong uVar1;
  bool bVar2;
  Result result;
  int iVar3;
  uint uVar4;
  bool bVar5;
  ulong uStack_38;
  bool has_sign;
  uint64_t value;
  uint *puStack_28;
  ParseIntType parse_type_local;
  uint *out_local;
  char *end_local;
  char *s_local;
  
  bVar5 = false;
  value._4_4_ = parse_type;
  puStack_28 = out;
  out_local = (uint *)end;
  end_local = s;
  if ((*s == '-') || (*s == '+')) {
    if (parse_type == UnsignedOnly) {
      Result::Result((Result *)((long)&s_local + 4),Error);
      return (Result)s_local._4_4_;
    }
    bVar5 = *s == '-';
    end_local = s + 1;
  }
  result = ParseUint64(end_local,end,&stack0xffffffffffffffc8);
  bVar2 = Failed(result);
  uVar1 = uStack_38;
  if (bVar2) {
    Result::Result((Result *)((long)&s_local + 4),Error);
  }
  else {
    if (bVar5) {
      iVar3 = std::numeric_limits<int>::max();
      if ((long)iVar3 + 1U < uVar1) {
        Result::Result((Result *)((long)&s_local + 4),Error);
        return (Result)s_local._4_4_;
      }
      uVar4 = std::numeric_limits<unsigned_int>::max();
      uStack_38 = (uVar4 - uStack_38) + 1;
    }
    else {
      uVar4 = std::numeric_limits<unsigned_int>::max();
      if (uVar4 < uVar1) {
        Result::Result((Result *)((long)&s_local + 4),Error);
        return (Result)s_local._4_4_;
      }
    }
    *puStack_28 = (uint)uStack_38;
    Result::Result((Result *)((long)&s_local + 4),Ok);
  }
  return (Result)s_local._4_4_;
}

Assistant:

Result ParseInt(const char* s,
                const char* end,
                U* out,
                ParseIntType parse_type) {
  typedef typename std::make_signed<U>::type S;
  uint64_t value;
  bool has_sign = false;
  if (*s == '-' || *s == '+') {
    if (parse_type == ParseIntType::UnsignedOnly) {
      return Result::Error;
    }
    if (*s == '-') {
      has_sign = true;
    }
    s++;
  }
  CHECK_RESULT(ParseUint64(s, end, &value));

  if (has_sign) {
    // abs(INTN_MIN) == INTN_MAX + 1.
    if (value > static_cast<uint64_t>(std::numeric_limits<S>::max()) + 1) {
      return Result::Error;
    }
    value = std::numeric_limits<U>::max() - value + 1;
  } else {
    if (value > static_cast<uint64_t>(std::numeric_limits<U>::max())) {
      return Result::Error;
    }
  }
  *out = static_cast<U>(value);
  return Result::Ok;
}